

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O1

int secp256k1_ec_pubkey_create(secp256k1_context *ctx,secp256k1_pubkey *pubkey,uchar *seckey)

{
  ulong uVar1;
  long lVar2;
  uint uVar3;
  bool bVar4;
  uint uVar5;
  secp256k1_scalar seckey_scalar;
  secp256k1_gej pj;
  secp256k1_ge p;
  secp256k1_scalar local_128;
  secp256k1_gej local_108;
  secp256k1_ge local_88;
  
  pubkey->data[0x30] = '\0';
  pubkey->data[0x31] = '\0';
  pubkey->data[0x32] = '\0';
  pubkey->data[0x33] = '\0';
  pubkey->data[0x34] = '\0';
  pubkey->data[0x35] = '\0';
  pubkey->data[0x36] = '\0';
  pubkey->data[0x37] = '\0';
  pubkey->data[0x38] = '\0';
  pubkey->data[0x39] = '\0';
  pubkey->data[0x3a] = '\0';
  pubkey->data[0x3b] = '\0';
  pubkey->data[0x3c] = '\0';
  pubkey->data[0x3d] = '\0';
  pubkey->data[0x3e] = '\0';
  pubkey->data[0x3f] = '\0';
  pubkey->data[0x20] = '\0';
  pubkey->data[0x21] = '\0';
  pubkey->data[0x22] = '\0';
  pubkey->data[0x23] = '\0';
  pubkey->data[0x24] = '\0';
  pubkey->data[0x25] = '\0';
  pubkey->data[0x26] = '\0';
  pubkey->data[0x27] = '\0';
  pubkey->data[0x28] = '\0';
  pubkey->data[0x29] = '\0';
  pubkey->data[0x2a] = '\0';
  pubkey->data[0x2b] = '\0';
  pubkey->data[0x2c] = '\0';
  pubkey->data[0x2d] = '\0';
  pubkey->data[0x2e] = '\0';
  pubkey->data[0x2f] = '\0';
  pubkey->data[0x10] = '\0';
  pubkey->data[0x11] = '\0';
  pubkey->data[0x12] = '\0';
  pubkey->data[0x13] = '\0';
  pubkey->data[0x14] = '\0';
  pubkey->data[0x15] = '\0';
  pubkey->data[0x16] = '\0';
  pubkey->data[0x17] = '\0';
  pubkey->data[0x18] = '\0';
  pubkey->data[0x19] = '\0';
  pubkey->data[0x1a] = '\0';
  pubkey->data[0x1b] = '\0';
  pubkey->data[0x1c] = '\0';
  pubkey->data[0x1d] = '\0';
  pubkey->data[0x1e] = '\0';
  pubkey->data[0x1f] = '\0';
  pubkey->data[0] = '\0';
  pubkey->data[1] = '\0';
  pubkey->data[2] = '\0';
  pubkey->data[3] = '\0';
  pubkey->data[4] = '\0';
  pubkey->data[5] = '\0';
  pubkey->data[6] = '\0';
  pubkey->data[7] = '\0';
  pubkey->data[8] = '\0';
  pubkey->data[9] = '\0';
  pubkey->data[10] = '\0';
  pubkey->data[0xb] = '\0';
  pubkey->data[0xc] = '\0';
  pubkey->data[0xd] = '\0';
  pubkey->data[0xe] = '\0';
  pubkey->data[0xf] = '\0';
  if ((ctx->ecmult_gen_ctx).prec == (secp256k1_ge_storage (*) [64] [16])0x0) {
    secp256k1_ec_pubkey_create_cold_1();
    uVar3 = 0;
  }
  else {
    secp256k1_scalar_set_b32(&local_128,seckey,(int *)&local_108);
    bVar4 = ((local_128.d[2] != 0 || local_128.d[3] != 0) ||
            (local_128.d[1] != 0 || local_128.d[0] != 0)) && (int)local_108.x.n[0] == 0;
    uVar3 = (uint)bVar4;
    uVar5 = bVar4 ^ 1;
    uVar1 = (ulong)uVar5 - 1;
    local_128.d[0] = local_128.d[0] & uVar1 | (ulong)uVar5;
    local_128.d[1] = local_128.d[1] & uVar1;
    local_128.d[2] = local_128.d[2] & uVar1;
    local_128.d[3] = uVar1 & local_128.d[3];
    secp256k1_ecmult_gen(&ctx->ecmult_gen_ctx,&local_108,&local_128);
    secp256k1_ge_set_gej(&local_88,&local_108);
    secp256k1_ge_to_storage((secp256k1_ge_storage *)&local_108,&local_88);
    *(uint64_t *)(pubkey->data + 0x30) = local_108.y.n[1];
    *(uint64_t *)(pubkey->data + 0x38) = local_108.y.n[2];
    *(uint64_t *)(pubkey->data + 0x20) = local_108.x.n[4];
    *(uint64_t *)(pubkey->data + 0x28) = local_108.y.n[0];
    *(uint64_t *)(pubkey->data + 0x10) = local_108.x.n[2];
    *(uint64_t *)(pubkey->data + 0x18) = local_108.x.n[3];
    *(ulong *)pubkey->data = CONCAT44(local_108.x.n[0]._4_4_,(int)local_108.x.n[0]);
    *(uint64_t *)(pubkey->data + 8) = local_108.x.n[1];
    lVar2 = 0;
    do {
      pubkey->data[lVar2] = pubkey->data[lVar2] & (char)uVar5 - 1U;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x40);
  }
  return uVar3;
}

Assistant:

int secp256k1_ec_pubkey_create(const secp256k1_context* ctx, secp256k1_pubkey *pubkey, const unsigned char *seckey) {
    secp256k1_ge p;
    secp256k1_scalar seckey_scalar;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(pubkey != NULL);
    memset(pubkey, 0, sizeof(*pubkey));
    ARG_CHECK(secp256k1_ecmult_gen_context_is_built(&ctx->ecmult_gen_ctx));
    ARG_CHECK(seckey != NULL);

    ret = secp256k1_ec_pubkey_create_helper(&ctx->ecmult_gen_ctx, &seckey_scalar, &p, seckey);
    secp256k1_pubkey_save(pubkey, &p);
    memczero(pubkey, sizeof(*pubkey), !ret);

    secp256k1_scalar_clear(&seckey_scalar);
    return ret;
}